

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint anon_unknown.dwarf_e7629::AllocateVariableInScope
               (ExpressionContext *ctx,SynBase *source,uint alignment,longlong size)

{
  ulong uVar1;
  uint uVar2;
  uint result_1;
  uint result;
  ScopeData *scope;
  longlong size_local;
  uint alignment_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((alignment & alignment - 1) != 0 || 0x10 < alignment) {
    __assert_fail("(alignment & (alignment - 1)) == 0 && alignment <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ac,
                  "unsigned int (anonymous namespace)::AllocateVariableInScope(ExpressionContext &, SynBase *, unsigned int, long long)"
                 );
  }
  _result_1 = ctx->scope;
  while( true ) {
    if (_result_1->scope == (ScopeData *)0x0) {
      if (_result_1 == ctx->globalScope) {
        uVar2 = AllocateGlobalVariable(ctx,source,alignment,size);
        return uVar2;
      }
      __assert_fail("scope == ctx.globalScope",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1db,
                    "unsigned int (anonymous namespace)::AllocateVariableInScope(ExpressionContext &, SynBase *, unsigned int, long long)"
                   );
    }
    if (_result_1->type == SCOPE_TEMPORARY) {
      return 0;
    }
    if (_result_1->ownerFunction != (FunctionData *)0x0) {
      uVar2 = GetAlignmentOffset(_result_1->dataSize,alignment);
      _result_1->dataSize = (ulong)uVar2 + _result_1->dataSize;
      uVar1 = _result_1->dataSize;
      if (0x1000000 < (long)((uVar1 & 0xffffffff) + size)) {
        ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
      }
      _result_1->dataSize = size + _result_1->dataSize;
      _result_1->ownerFunction->stackSize = _result_1->dataSize;
      return (uint)uVar1;
    }
    if (_result_1->ownerType != (TypeBase *)0x0) break;
    _result_1 = _result_1->scope;
  }
  uVar2 = GetAlignmentOffset(_result_1->dataSize,alignment);
  _result_1->dataSize = (ulong)uVar2 + _result_1->dataSize;
  uVar1 = _result_1->dataSize;
  if (0x1000000 < (long)((uVar1 & 0xffffffff) + size)) {
    ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
  }
  _result_1->dataSize = size + _result_1->dataSize;
  _result_1->ownerType->size = _result_1->dataSize;
  return (uint)uVar1;
}

Assistant:

unsigned AllocateVariableInScope(ExpressionContext &ctx, SynBase *source, unsigned alignment, long long size)
	{
		assert((alignment & (alignment - 1)) == 0 && alignment <= 16);

		ScopeData *scope = ctx.scope;

		while(scope->scope)
		{
			// Don't let allocations escape the temporary scope
			if(scope->type == SCOPE_TEMPORARY)
			{
				return 0;
			}

			if(scope->ownerFunction)
			{
				scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

				unsigned result = unsigned(scope->dataSize);

				if(result + size > (1 << 24))
					ctx.Stop(source, "ERROR: variable size limit exceeded");

				scope->dataSize += size;

				scope->ownerFunction->stackSize = scope->dataSize;

				return result;
			}

			if(scope->ownerType)
			{
				scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

				unsigned result = unsigned(scope->dataSize);

				if(result + size > (1 << 24))
					ctx.Stop(source, "ERROR: variable size limit exceeded");

				scope->dataSize += size;

				scope->ownerType->size = scope->dataSize;

				return result;
			}

			scope = scope->scope;
		}

		assert(scope == ctx.globalScope);

		return AllocateGlobalVariable(ctx, source, alignment, size);
	}